

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseOutgoing.cpp
# Opt level: O3

bool __thiscall tonk::SessionOutgoing::PostDummyDatagram(SessionOutgoing *this)

{
  atomic<int> *paVar1;
  int *piVar2;
  SimpleCipher *this_00;
  ostringstream *this_01;
  bool bVar3;
  undefined4 uVar4;
  IUDPSender *pIVar5;
  SenderBandwidthControl *pSVar6;
  Channel *pCVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  int iVar10;
  uint8_t *puVar11;
  uint64_t uVar12;
  OutputWorker *this_02;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint8_t *puVar16;
  undefined1 local_1b8 [392];
  
  if (((this->HasPeerAddress)._M_base._M_i & 1U) == 0) {
    pCVar7 = (this->Deps).Logger;
    if ((int)pCVar7->ChannelMinLevel < 4) {
      local_1b8._0_8_ = pCVar7->ChannelName;
      this_01 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._8_4_ = Warning;
      std::__cxx11::ostringstream::ostringstream(this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,(pCVar7->Prefix)._M_dataplus._M_p,
                 (pCVar7->Prefix)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01,"PostDummyDatagram ignored before peer address is known",0x36);
      this_02 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(this_02,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(this_01);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  else {
    iVar10 = pthread_mutex_lock((pthread_mutex_t *)&this->super_OutgoingQueueCommon);
    if (iVar10 != 0) {
      std::__throw_system_error(iVar10);
    }
    puVar11 = pktalloc::Allocator::Allocate
                        (&(this->super_OutgoingQueueCommon).WriteAllocator.Allocator,0x553);
    pthread_mutex_unlock((pthread_mutex_t *)&this->super_OutgoingQueueCommon);
    if (puVar11 != (uint8_t *)0x0) {
      puVar11[0x10] = '\x12';
      puVar11[0x11] = '%';
      memset(puVar11 + 0x12,0,0x512);
      bVar3 = this->ShouldCompressSequenceNumbers;
      uVar12 = this->NextNonce;
      this->NextNonce = uVar12 + 1;
      uVar13 = 3;
      if (bVar3 == true) {
        uVar14 = (int)uVar12 - (int)(this->LastAck).PeerNextExpectedNonce.Value;
        uVar13 = 0;
        if (uVar14 != 1) {
          uVar13 = 1;
          uVar15 = -uVar14;
          if (0 < (int)uVar14) {
            uVar15 = uVar14;
          }
          if (0x7e < uVar15) {
            uVar13 = 3 - (uVar15 < 0x7fff);
          }
        }
      }
      *(int *)(puVar11 + 0x524) = (int)uVar12;
      puVar16 = (uint8_t *)((ulong)uVar13 + (long)(puVar11 + 0x524));
      uVar13 = (bVar3 + 4) * 0x20 + uVar13 * 4;
      puVar11 = puVar11 + 0x10;
      if (((this->ShouldAttachHandshake)._M_base._M_i & 1U) != 0) {
        uVar4 = *(undefined4 *)(this->Handshake + 8);
        uVar13 = uVar13 | 0x40;
        *(undefined8 *)puVar16 = *(undefined8 *)this->Handshake;
        *(undefined4 *)(puVar16 + 8) = uVar4;
        puVar16 = puVar16 + 0xc;
      }
      this_00 = &this->Encryptor;
      puVar16[3] = (uint8_t)uVar13;
      uVar14 = (int)puVar16 - (int)puVar11;
      security::SimpleCipher::Cipher(this_00,puVar11,0x514,uVar12);
      uVar8 = security::SimpleCipher::Tag(this_00,puVar11,uVar14,uVar12);
      iVar10 = uVar14 + 6;
      uVar12 = siamese::GetTimeUsec();
      uVar9 = security::SimpleCipher::TagInt(this_00,uVar13 & 0xff | (int)(uVar12 >> 3) << 8);
      puVar16[2] = (uint8_t)(uVar12 >> 0x13);
      *(short *)puVar16 = (short)(uVar12 >> 3);
      *(uint16_t *)(puVar16 + 4) = uVar9 ^ uVar8;
      pIVar5 = (this->Deps).UDPSender;
      (*pIVar5->_vptr_IUDPSender[2])(pIVar5,&this->PeerUDPAddress,(this->Deps).ConnectionRef);
      pSVar6 = (this->Deps).SenderControl;
      LOCK();
      paVar1 = &pSVar6->AvailableTokens;
      (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i - iVar10;
      UNLOCK();
      piVar2 = &pSVar6->ProbeSendTokens;
      *piVar2 = *piVar2 + iVar10;
      return true;
    }
  }
  return false;
}

Assistant:

bool SessionOutgoing::PostDummyDatagram()
{
    if (!HasPeerAddress)
    {
        Deps.Logger->Warning("PostDummyDatagram ignored before peer address is known");
        return false;
    }

    TONK_DEBUG_ASSERT(protocol::kDummyBytes + protocol::kMaxOverheadBytes < UDPMaxDatagramBytes);

    // Allocate space for queued datagram
    OutgoingQueuedDatagram* datagram = (OutgoingQueuedDatagram*)WriteAllocator.Allocate(
        kQueueHeaderBytes + protocol::kDummyBytes + protocol::kMaxOverheadBytes + protocol::kMaxRandomPaddingBytes);
    if (!datagram) {
        return false;
    }

    // No need to call Initialize on the OutgoingQueuedDatagram object

    uint8_t* datagramData = datagram->Data;
    unsigned messageBytes = protocol::kDummyBytes;

    const static unsigned kZeroBytes = protocol::kDummyBytes - protocol::kMessageFrameBytes;
    protocol::WriteMessageFrameHeader(
        datagram->Data,
        protocol::MessageType_Padding,
        kZeroBytes);
    memset(datagram->Data + protocol::kMessageFrameBytes, 0, kZeroBytes);

    // The following code must be kept in sync with sendQueuedDatagram().
    // It is inlined and optimized for this common case:

    // No random padding

    uint8_t* footer = datagramData + messageBytes;
    uint8_t flags = protocol::kConnectionMask;
    if (ShouldCompressSequenceNumbers) {
        flags |= protocol::kSeqCompMask;
    }

    // No reliable sequence number

    // Write packet nonce to header
    unsigned nonceBytes;
    NonceT nonce = writeNonce(footer, nonceBytes);
    flags |= nonceBytes << 2;
    footer += nonceBytes;

    if (ShouldAttachHandshake)
    {
        flags |= protocol::kHandshakeMask;
        const uint32_t b = siamese::ReadU32_LE(Handshake + 8);
        const uint64_t a = siamese::ReadU64_LE(Handshake);
        siamese::WriteU64_LE(footer, a);
        siamese::WriteU32_LE(footer + 8, b);
        footer += protocol::kHandshakeBytes;
    }

    // Tag checksum includes all the data before the timestamp
    const unsigned taggedBytes = (unsigned)(footer - datagramData);

    // Skip over the timestamp
    uint8_t* timestampData = footer;
    footer += protocol::kTimestampBytes;

    // Write flags
    footer[0] = flags;
    ++footer;

    Encryptor.Cipher(datagramData, messageBytes, nonce);

    // Write tag
    uint16_t tag = Encryptor.Tag(datagramData, taggedBytes, nonce);
    static_assert(protocol::kEncryptionTagBytes == 2, "Update this if that changes");
    uint8_t* tagData = footer;

    const unsigned sendBytes = taggedBytes + protocol::kUntaggedDatagramBytes;

    DatagramBuffer datagramBuffer;
    datagramBuffer.AllocatorForFree = &WriteAllocator;
    datagramBuffer.Data = datagramData;
    datagramBuffer.FreePtr = datagram;
    datagramBuffer.Bytes = sendBytes;

    TONK_DEBUG_ASSERT(Deps.UDPSender != nullptr);
    TONK_DEBUG_ASSERT(HasPeerAddress);

#ifdef TONK_DETAILED_STATS
    DetailStats* stats = Deps.Deets->GetWritePtr();
    stats->Stats[Stats_DummyBytesSent] += messageBytes - protocol::kMessageFrameBytes;
    stats->Stats[Stats_FramingBytesSent] += protocol::kMessageFrameBytes;
    stats->Stats[Stats_FootersBytesSent] += sendBytes - messageBytes;
#endif // TONK_DETAILED_STATS

    // Write timestamp and final tag - Reduce noise in timestamp measurements
    const uint64_t nowUsec = siamese::GetTimeUsec();
    const uint32_t timestamp24 = (uint32_t)(nowUsec >> kTime23LostBits);
    tag ^= Encryptor.TagInt(protocol::TimestampFlagTagInt(timestamp24, flags));
    siamese::WriteU24_LE(timestampData, timestamp24);
    siamese::WriteU16_LE(tagData, tag);

    // Send the data
    Deps.UDPSender->Send(
        PeerUDPAddress,
        datagramBuffer,
        Deps.ConnectionRef);

    const unsigned kCompressionSavings = 0;
    const bool kNotReliable = false;

    // Update bandwidth control
    Deps.SenderControl->OnSendDatagram(
        kCompressionSavings,
        sendBytes,
        kNotReliable);

#ifdef TONK_ENABLE_VERBOSE_OUTGOING
    ++m_Recovery;
    Deps.Logger->Info("Recovery sent. Current send rate = ", (float)m_Recovery / (float)m_Reliable);
#endif // TONK_ENABLE_VERBOSE_OUTGOING

    return true;
}